

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

void __thiscall IDisk::DumpTrack(IDisk *this,int side,uint track,int rev)

{
  ILog *pIVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  int i;
  long lVar5;
  char cVar6;
  
  cVar6 = '\0';
  for (uVar2 = 0; uVar2 < this->side_[side].tracks[track].size; uVar2 = uVar2 + 0x10) {
    uVar3 = (ulong)uVar2;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        cVar6 = (cVar6 + '\x01') - (lVar4 + uVar3 < (ulong)this->side_[side].tracks[track].size);
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 8))();
      }
      uVar3 = uVar3 + 8;
    }
  }
  if (this->log_ != (ILog *)0x0) {
    (**(code **)(*(long *)this->log_ + 0x20))();
    pIVar1 = this->log_;
    if (pIVar1 != (ILog *)0x0) {
      (**(code **)(*(long *)pIVar1 + 8))(pIVar1,cVar6);
      return;
    }
  }
  return;
}

Assistant:

void IDisk::DumpTrack(int side, unsigned int track, int rev)
{
   unsigned int index = 0;
   int shift = 0;
   while (index < side_[side].tracks[track].size)
   {
      for (int i = 0; i < 2; i++)
      {
         unsigned char byte = 0;
         for (int j = 0; j < 8; j++)
         {
            byte <<= 1;
            unsigned char b = (index + i * 8 + j < side_[side].tracks[track].size)
                                 ? side_[side].tracks[track].bitfield[index + i * 8 + (j * 2)]
                                 : 0;
            byte |= b & 0x1;

            if (index + i * 8 + j >= side_[side].tracks[track]./*Revolution[rev].*/size)
               shift++;
         }
         LOGB(byte)
      }
      index += 16;
   }
   LOGEOL
   LOGB(shift)
}